

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

Acb_Mfs_t * Acb_MfsStart(Acb_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  int iVar1;
  Acb_Mfs_t *pAVar2;
  sat_solver *psVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  abctime aVar6;
  timespec ts;
  timespec local_28;
  
  pAVar2 = (Acb_Mfs_t *)calloc(1,0xb0);
  pAVar2->pNtk = pNtk;
  pAVar2->pPars = pPars;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    aVar6 = -1;
  }
  else {
    aVar6 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  pAVar2->timeTotal = aVar6;
  psVar3 = sat_solver_new();
  pAVar2->pSat[0] = psVar3;
  psVar3 = sat_solver_new();
  pAVar2->pSat[1] = psVar3;
  psVar3 = sat_solver_new();
  pAVar2->pSat[2] = psVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pAVar2->vSupp = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pAVar2->vFlip = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pAVar2->vValues = pVVar4;
  return pAVar2;
}

Assistant:

Acb_Mfs_t * Acb_MfsStart( Acb_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    Acb_Mfs_t * p = ABC_CALLOC( Acb_Mfs_t, 1 );
    p->pNtk       = pNtk;
    p->pPars      = pPars;
    p->timeTotal  = Abc_Clock();
    p->pSat[0]    = sat_solver_new();
    p->pSat[1]    = sat_solver_new();
    p->pSat[2]    = sat_solver_new();
    p->vSupp      = Vec_IntAlloc(100);
    p->vFlip      = Vec_IntAlloc(100);
    p->vValues    = Vec_IntAlloc(100);
    return p;
}